

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  sqlite3 *db_00;
  Table *pTab;
  int iVar1;
  int iVar2;
  int p3;
  int p2;
  int addr;
  Vdbe *p_00;
  Table *pTable;
  char *pcVar3;
  void *pvVar4;
  Token *local_100;
  int nName;
  char *zName;
  Schema *pSchema;
  Table *pOld;
  Db *pDb;
  Token *pEnd2;
  Table *pSelTab;
  int addrInsLoop;
  int regRowid;
  int regRec;
  int addrTop;
  int regYield;
  SelectDest dest;
  char *zStmt;
  char *zType2;
  char *zType;
  Vdbe *v;
  Index *pIStack_58;
  int n;
  Index *pIdx;
  int iDb;
  sqlite3 *db;
  Table *p;
  Select *pSelect_local;
  u8 tabOpts_local;
  Token *pEnd_local;
  Token *pCons_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (((pEnd != (Token *)0x0) || (pSelect != (Select *)0x0)) &&
     (pTab = pParse->pNewTable, pTab != (Table *)0x0)) {
    if (((db_00->init).busy != '\0') && (pTab->tnum = (db_00->init).newTnum, pTab->tnum == 1)) {
      pTab->tabFlags = pTab->tabFlags | 1;
    }
    if ((tabOpts & 0x20) != 0) {
      if ((pTab->tabFlags & 8) != 0) {
        sqlite3ErrorMsg(pParse,"AUTOINCREMENT not allowed on WITHOUT ROWID tables");
        return;
      }
      if ((pTab->tabFlags & 4) == 0) {
        sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
      }
      else {
        pTab->tabFlags = pTab->tabFlags | 0x60;
        convertToWithoutRowidTable(pParse,pTab);
      }
    }
    iVar1 = sqlite3SchemaToIndex(db_00,pTab->pSchema);
    if (pTab->pCheck != (ExprList *)0x0) {
      sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
    }
    estimateTableWidth(pTab);
    for (pIStack_58 = pTab->pIndex; pIStack_58 != (Index *)0x0; pIStack_58 = pIStack_58->pNext) {
      estimateIndexWidth(pIStack_58);
    }
    if ((db_00->init).busy == '\0') {
      p_00 = sqlite3GetVdbe(pParse);
      if (p_00 == (Vdbe *)0x0) {
        return;
      }
      sqlite3VdbeAddOp1(p_00,0x6f,0);
      if (pTab->pSelect == (Select *)0x0) {
        zType2 = "table";
        pcVar3 = "CREATE_TABLE";
      }
      else {
        zType2 = "view";
        pcVar3 = "CREATE_VIEW";
      }
      zStmt = pcVar3 + 7;
      if (pSelect != (Select *)0x0) {
        iVar2 = pParse->nMem + 1;
        pParse->nMem = iVar2;
        p3 = pParse->nMem + 1;
        pParse->nMem = p3;
        p2 = pParse->nMem + 1;
        pParse->nMem = p2;
        sqlite3MayAbort(pParse);
        sqlite3VdbeAddOp3(p_00,0x69,1,pParse->regRoot,iVar1);
        sqlite3VdbeChangeP5(p_00,0x10);
        pParse->nTab = 2;
        addr = sqlite3VdbeCurrentAddr(p_00);
        sqlite3VdbeAddOp3(p_00,0xf,iVar2,0,addr + 1);
        sqlite3SelectDestInit((SelectDest *)&addrTop,0xd,iVar2);
        sqlite3Select(pParse,pSelect,(SelectDest *)&addrTop);
        sqlite3VdbeEndCoroutine(p_00,iVar2);
        sqlite3VdbeJumpHere(p_00,addr);
        if (pParse->nErr != 0) {
          return;
        }
        pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
        if (pTable == (Table *)0x0) {
          return;
        }
        pTab->nCol = pTable->nCol;
        pTab->aCol = pTable->aCol;
        pTable->nCol = 0;
        pTable->aCol = (Column *)0x0;
        sqlite3DeleteTable(db_00,pTable);
        iVar2 = sqlite3VdbeAddOp1(p_00,0x10,(int)dest.zAffSdst);
        sqlite3VdbeAddOp3(p_00,99,dest.zAffSdst._4_4_,dest.iSDParm,p3);
        sqlite3TableAffinity(p_00,pTab,0);
        sqlite3VdbeAddOp2(p_00,0x72,1,p2);
        sqlite3VdbeAddOp3(p_00,0x73,1,p3,p2);
        sqlite3VdbeGoto(p_00,iVar2);
        sqlite3VdbeJumpHere(p_00,iVar2);
        sqlite3VdbeAddOp1(p_00,0x6f,1);
      }
      if (pSelect == (Select *)0x0) {
        local_100 = pEnd;
        if (tabOpts != '\0') {
          local_100 = &pParse->sLastToken;
        }
        v._4_4_ = (int)local_100->z - (int)(pParse->sNameToken).z;
        if (*local_100->z != ';') {
          v._4_4_ = local_100->n + v._4_4_;
        }
        dest.pOrderBy =
             (ExprList *)
             sqlite3MPrintf(db_00,"CREATE %s %.*s",zStmt,(ulong)v._4_4_,(pParse->sNameToken).z);
      }
      else {
        dest.pOrderBy = (ExprList *)createTableStmt(db_00,pTab);
      }
      sqlite3NestedParse(pParse,
                         "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                         ,db_00->aDb[iVar1].zDbSName,"sqlite_master",zType2,pTab->zName,pTab->zName,
                         pParse->regRoot,dest.pOrderBy,pParse->regRowid);
      sqlite3DbFree(db_00,dest.pOrderBy);
      sqlite3ChangeCookie(pParse,iVar1);
      if (((pTab->tabFlags & 8) != 0) && ((db_00->aDb[iVar1].pSchema)->pSeqTab == (Table *)0x0)) {
        sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",
                           db_00->aDb[iVar1].zDbSName);
      }
      pcVar3 = sqlite3MPrintf(db_00,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
      sqlite3VdbeAddParseSchemaOp(p_00,iVar1,pcVar3);
    }
    if ((db_00->init).busy != '\0') {
      pvVar4 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
      if (pvVar4 == (void *)0x0) {
        pParse->pNewTable = (Table *)0x0;
        db_00->flags = db_00->flags | 2;
        if (pTab->pSelect == (Select *)0x0) {
          pcVar3 = (pParse->sNameToken).z;
          pEnd_local = pCons;
          if (pCons->z == (char *)0x0) {
            pEnd_local = pEnd;
          }
          iVar1 = sqlite3Utf8CharLen(pcVar3,(int)pEnd_local->z - (int)pcVar3);
          pTab->addColOffset = iVar1 + 0xd;
        }
      }
      else {
        sqlite3OomFault(db_00);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  assert( !db->init.busy || !pSelect );

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->flags |= SQLITE_InternChanges;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}